

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorNode::DescriptorNode
          (DescriptorNode *this,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters,NetType network_type)

{
  NetType network_type_local;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  DescriptorNode *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::string((string *)&this->value_);
  ::std::__cxx11::string::string((string *)&this->key_info_);
  this->is_uncompressed_key_ = false;
  ::std::__cxx11::string::string((string *)&this->base_extkey_);
  ::std::__cxx11::string::string((string *)&this->tweak_sum_);
  this->number_ = 0;
  ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::vector
            (&this->child_node_);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  ::map(&this->tree_node_);
  ::std::__cxx11::string::string((string *)&this->checksum_);
  this->depth_ = 0;
  this->need_arg_num_ = 0;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&this->addr_prefixes_);
  ::std::__cxx11::string::string((string *)&this->parent_kind_);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(&this->addr_prefixes_,network_parameters);
  this->network_type_ = network_type;
  return;
}

Assistant:

DescriptorNode::DescriptorNode(
    const std::vector<AddressFormatData>& network_parameters,
    NetType network_type) {
  addr_prefixes_ = network_parameters;
  network_type_ = network_type;
}